

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeXYZnode::ComputeQ
          (ChLoadXYZnodeXYZnode *this,ChState *state_x,ChStateDelta *state_w)

{
  ChVector<double> *pCVar1;
  ChVectorDynamic<> *vector;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 local_118 [16];
  double local_108;
  ChVector<double> local_f8;
  undefined1 local_d8 [16];
  double local_c8;
  ChVector<double> local_b8;
  shared_ptr<chrono::ChNodeXYZ> mnodeB;
  shared_ptr<chrono::ChNodeXYZ> mnodeA;
  ChVector<double> v;
  undefined1 local_38 [32];
  
  std::dynamic_pointer_cast<chrono::ChNodeXYZ,chrono::ChLoadable>
            ((shared_ptr<chrono::ChLoadable> *)&mnodeA);
  std::dynamic_pointer_cast<chrono::ChNodeXYZ,chrono::ChLoadable>
            ((shared_ptr<chrono::ChLoadable> *)&mnodeB);
  local_b8.m_data[2] = 0.0;
  local_c8 = 0.0;
  local_f8.m_data[2] = 0.0;
  local_108 = 0.0;
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  local_d8 = ZEXT816(0);
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  local_118 = ZEXT816(0);
  if (state_x == (ChState *)0x0) {
    if (&(mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos !=
        &local_b8) {
      local_b8.m_data[0] =
           ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
           m_data[0];
      local_b8.m_data[1] =
           ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
           m_data[1];
      local_b8.m_data[2] =
           ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
           m_data[2];
    }
    if (&(mnodeB.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos !=
        &local_f8) {
      local_f8.m_data[0] =
           ((mnodeB.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
           m_data[0];
      local_f8.m_data[1] =
           ((mnodeB.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
           m_data[1];
      local_f8.m_data[2] =
           ((mnodeB.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
           m_data[2];
    }
  }
  else {
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&v,
               &state_x->super_ChVectorDynamic<double>,0,3);
    ChVector<double>::operator=
              (&local_b8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)&v
              );
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&v,
               &state_x->super_ChVectorDynamic<double>,3,3);
    ChVector<double>::operator=
              (&local_f8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)&v
              );
  }
  if (state_w == (ChStateDelta *)0x0) {
    auVar2 = ZEXT816(0) << 0x40;
    dVar4 = 0.0;
    local_38._16_8_ = 0.0;
    auVar3 = ZEXT816(0) << 0x40;
    if (&(mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos_dt
        != (ChVector<double> *)local_d8) {
      auVar3 = *(undefined1 (*) [16])
                ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                pos_dt).m_data;
      local_38._16_8_ =
           ((mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           pos_dt).m_data[2];
      local_d8 = auVar3;
      local_c8 = (double)local_38._16_8_;
    }
    if (&(mnodeB.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos_dt
        != (ChVector<double> *)local_118) {
      auVar2 = *(undefined1 (*) [16])
                ((mnodeB.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                pos_dt).m_data;
      dVar4 = ((mnodeB.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pos_dt).m_data[2];
      local_118 = auVar2;
      local_108 = dVar4;
    }
  }
  else {
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&v,
               &state_w->super_ChVectorDynamic<double>,0,3);
    ChVector<double>::operator=
              ((ChVector<double> *)local_d8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)&v
              );
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&v,
               &state_w->super_ChVectorDynamic<double>,3,3);
    ChVector<double>::operator=
              ((ChVector<double> *)local_118,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)&v
              );
    auVar2 = local_118;
    dVar4 = local_108;
    local_38._16_8_ = local_c8;
    auVar3 = local_d8;
  }
  local_38._0_16_ = vsubpd_avx(auVar3,auVar2);
  auVar2._8_8_ = local_b8.m_data[1];
  auVar2._0_8_ = local_b8.m_data[0];
  local_38._16_8_ = (double)local_38._16_8_ - dVar4;
  pCVar1 = &this->computed_abs_force;
  auVar3._8_8_ = local_f8.m_data[1];
  auVar3._0_8_ = local_f8.m_data[0];
  v.m_data._0_16_ = vsubpd_avx(auVar2,auVar3);
  v.m_data[2] = local_b8.m_data[2] - local_f8.m_data[2];
  (*(this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
            (this,&v,local_38,pCVar1);
  vector = &(this->super_ChLoadCustomMultiple).load_Q;
  local_38._0_8_ = pCVar1;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&v,vector,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&v,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_38);
  local_38._0_8_ = pCVar1;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&v,vector,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&v,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnodeB.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnodeA.super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void ChLoadXYZnodeXYZnode::ComputeQ(ChState* state_x, ChStateDelta* state_w) {

	auto mnodeA = std::dynamic_pointer_cast<ChNodeXYZ>(this->loadables[0]);
	auto mnodeB = std::dynamic_pointer_cast<ChNodeXYZ>(this->loadables[1]);

	ChVector<> nodeApos;
	ChVector<> nodeApos_dt;
	ChVector<> nodeBpos;
	ChVector<> nodeBpos_dt;

	if (state_x) {
        // the numerical jacobian algo might change state_x
        nodeApos = state_x->segment(0, 3);
		nodeBpos = state_x->segment(3, 3);
    } else {
		nodeApos = mnodeA->GetPos();
		nodeBpos = mnodeB->GetPos();
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
		nodeApos_dt = state_w->segment(0, 3);
		nodeBpos_dt = state_w->segment(3, 3);
    } else {
        nodeApos_dt = mnodeA->GetPos_dt();
		nodeBpos_dt = mnodeB->GetPos_dt();
    }

	ComputeForce((nodeApos-nodeBpos), (nodeApos_dt-nodeBpos_dt), computed_abs_force);

    // Compute Q 
    load_Q.segment(0, 3) = computed_abs_force.eigen();
    load_Q.segment(3, 3) = -computed_abs_force.eigen();
}